

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartsBupOutputter.cpp
# Opt level: O2

ssize_t __thiscall PartsBupOutputter::write(PartsBupOutputter *this,int __fd,void *__buf,size_t __n)

{
  pointer this_00;
  pointer pIVar1;
  Blend BVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string *local_68;
  anon_class_8_1_8991fb9c path;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  size_type local_48;
  char local_40 [16];
  
  std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>::
  emplace_back<>(&(this->expressions).
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].second);
  pIVar1 = (this->expressions).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].second.
           super__Vector_base<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = pIVar1 + -1;
  path.this = this;
  write::anon_class_8_1_8991fb9c::operator()(&local_88,&path,&this->baseName);
  local_50._M_p = local_40;
  local_58._0_4_ = 0;
  local_58._4_4_ = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p == &local_88.field_2) {
    local_40[8] = local_88.field_2._M_local_buf[8];
    local_40[9] = local_88.field_2._M_local_buf[9];
    local_40[10] = local_88.field_2._M_local_buf[10];
    local_40[0xb] = local_88.field_2._M_local_buf[0xb];
    local_40[0xc] = local_88.field_2._M_local_buf[0xc];
    local_40[0xd] = local_88.field_2._M_local_buf[0xd];
    local_40[0xe] = local_88.field_2._M_local_buf[0xe];
    local_40[0xf] = local_88.field_2._M_local_buf[0xf];
  }
  else {
    local_50._M_p = local_88._M_dataplus._M_p;
  }
  local_48 = local_88._M_string_length;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::
  vector<std::pair<Point,std::__cxx11::string>,std::allocator<std::pair<Point,std::__cxx11::string>>>
  ::emplace_back<std::pair<Point,std::__cxx11::string>>
            ((vector<std::pair<Point,std::__cxx11::string>,std::allocator<std::pair<Point,std::__cxx11::string>>>
              *)this_00,
             (pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_58);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_88);
  local_68 = (string *)&this->withFaceName;
  if ((this->withFaceName)._M_string_length != 0) {
    write::anon_class_8_1_8991fb9c::operator()(&local_88,&path,(string *)local_68);
    std::
    pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    pair<Point_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ((pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_58,&this->facePos,&local_88);
    std::
    vector<std::pair<Point,std::__cxx11::string>,std::allocator<std::pair<Point,std::__cxx11::string>>>
    ::emplace_back<std::pair<Point,std::__cxx11::string>>
              ((vector<std::pair<Point,std::__cxx11::string>,std::allocator<std::pair<Point,std::__cxx11::string>>>
                *)this_00,
               (pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_58);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_88);
    BVar2 = this->faceBlend;
    if (pIVar1[-1].color != AlphaBlend) {
      if (BVar2 != NotPossible) goto LAB_0010e5b7;
      BVar2 = NotPossible;
    }
    pIVar1[-1].color = BVar2;
  }
LAB_0010e5b7:
  if ((this->withMouthName)._M_string_length == 0) {
    poVar3 = (ostream *)(ulong)pIVar1[-1].color;
  }
  else {
    write::anon_class_8_1_8991fb9c::operator()(&local_88,&path,&this->withMouthName);
    std::
    pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    pair<Point_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ((pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_58,&this->mouthPos,&local_88);
    std::
    vector<std::pair<Point,std::__cxx11::string>,std::allocator<std::pair<Point,std::__cxx11::string>>>
    ::emplace_back<std::pair<Point,std::__cxx11::string>>
              ((vector<std::pair<Point,std::__cxx11::string>,std::allocator<std::pair<Point,std::__cxx11::string>>>
                *)this_00,
               (pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_58);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_88);
    BVar2 = this->mouthBlend;
    poVar3 = (ostream *)(ulong)pIVar1[-1].color;
    if (pIVar1[-1].color != AlphaBlend) {
      if (BVar2 != NotPossible) goto LAB_0010e634;
      BVar2 = NotPossible;
    }
    pIVar1[-1].color = BVar2;
    poVar3 = (ostream *)(ulong)BVar2;
  }
LAB_0010e634:
  if ((int)poVar3 == 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Warning: ");
    poVar3 = std::operator<<(poVar3,local_68);
    poVar3 = std::operator<<(poVar3,
                             " has fully transparent overridden pixels, it may not be properly renderable"
                            );
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  }
  return (ssize_t)poVar3;
}

Assistant:

void write() override {
		expressions.back().second.emplace_back();
		ImageEntry& cur = expressions.back().second.back();

		auto addColor = [&](Blend type){
			if (cur.color == Blend::AlphaBlend) {
				cur.color = type;
			} else if (type == Blend::NotPossible) {
				cur.color = type;
			}
		};
		auto path = [&](const std::string& name){
			return baseName + "/" + name + ".png";
		};

		cur.parts.push_back({{0, 0}, path(baseName)});
		if (!withFaceName.empty()) {
			cur.parts.push_back({facePos, path(withFaceName)});
			addColor(faceBlend);
		}
		if (!withMouthName.empty()) {
			cur.parts.push_back({mouthPos, path(withMouthName)});
			addColor(mouthBlend);
		}
		if (cur.color == Blend::NotPossible) {
			std::cerr << "Warning: " << withFaceName << " has fully transparent overridden pixels, it may not be properly renderable" << std::endl;
		}
	}